

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

void __thiscall btVectorX<float>::btVectorX(btVectorX<float> *this,int numRows)

{
  uint in_EAX;
  undefined8 uStack_18;
  
  (this->m_storage).m_ownsMemory = true;
  (this->m_storage).m_data = (float *)0x0;
  (this->m_storage).m_size = 0;
  (this->m_storage).m_capacity = 0;
  uStack_18 = (ulong)in_EAX;
  btAlignedObjectArray<float>::resize(&this->m_storage,numRows,(float *)((long)&uStack_18 + 4));
  return;
}

Assistant:

btVectorX(int numRows)
	{
		m_storage.resize(numRows);
	}